

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyIntegerAnyOf
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_1e0 [3];
  MessageBuilder local_1c8;
  uchar local_41;
  ulong uStack_40;
  GLboolean expectedGLState;
  size_t ndx;
  size_t sStack_30;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  size_t referencesLength_local;
  GLint *references_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  sStack_30 = referencesLength;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_char> *)((long)&ndx + 5));
  puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     ((StateQueryMemoryWriteGuard<unsigned_char> *)((long)&ndx + 5));
  glu::CallLogWrapper::glGetBooleanv(&(this->super_StateVerifier).super_CallLogWrapper,name,puVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char> *)((long)&ndx + 5),testCtx);
  if (bVar1) {
    for (uStack_40 = 0; uStack_40 < sStack_30; uStack_40 = uStack_40 + 1) {
      local_41 = references[uStack_40] != 0;
      puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)((long)&ndx + 5));
      if (*puVar3 == local_41) {
        return;
      }
    }
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [15])"// ERROR: got ");
    puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                       ((StateQueryMemoryWriteGuard *)((long)&ndx + 5));
    local_1e0[0] = "mapped_ == GL_FALSE";
    if (*puVar3 == '\x01') {
      local_1e0[0] = "mapped_ == GL_TRUE";
    }
    local_1e0[0] = local_1e0[0] + 0xb;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1e0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLboolean expectedGLState = references[ndx] ? GL_TRUE : GL_FALSE;

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << (state==GL_TRUE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
}